

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

pair<QHostAddress,_int> QHostAddress::parseSubnet(QString *subnet)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  char *__file;
  qsizetype qVar4;
  pair<QHostAddress,_int> *i_00;
  __off_t __length;
  undefined8 extraout_RDX;
  pair<QHostAddress,_int> *in_RSI;
  QHostAddressPrivate *in_RDI;
  long in_FS_OFFSET;
  pair<QHostAddress,_int> pVar5;
  quint32 mask_1;
  uint byteValue;
  int i;
  quint32 addr;
  bool isIpv6;
  qsizetype slash;
  bool ok_1;
  QList<QStringView> parts;
  QHostAddress net;
  bool ok;
  QNetmask parser;
  QHostAddress mask;
  int netmask;
  QStringView netStr;
  pair<QHostAddress,_int> invalid;
  pair<QHostAddress,_int> *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  byte in_stack_fffffffffffffec7;
  pair<QHostAddress,_int> *in_stack_fffffffffffffec8;
  pair<QHostAddress,_int> *in_stack_fffffffffffffed0;
  pair<QHostAddress,_int> *this;
  QHostAddress this_00;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  QChar in_stack_fffffffffffffeee;
  QChar local_ca;
  QList<QStringView> local_c8 [2];
  undefined8 local_98;
  QStringView local_80;
  byte local_69;
  undefined1 local_68 [31];
  QNetmask local_49;
  undefined8 local_48;
  QChar local_40;
  QChar local_3e;
  uint local_3c;
  QStringView local_38;
  QChar local_26;
  undefined4 local_24;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)in_RDI;
  QHostAddress((QHostAddress *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  local_24 = 0xffffffff;
  std::pair<QHostAddress,_int>::pair<QHostAddress,_int,_true>
            (in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->first,
             (int *)CONCAT17(in_stack_fffffffffffffec7,
                             CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  ~QHostAddress((QHostAddress *)0x217db3);
  bVar1 = QString::isEmpty((QString *)0x217dbd);
  if (bVar1) {
    std::pair<QHostAddress,_int>::pair
              ((pair<QHostAddress,_int> *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               in_stack_fffffffffffffeb8);
    goto LAB_0021846d;
  }
  this = in_RSI;
  QChar::QChar<char16_t,_true>(&local_26,L'/');
  __file = (char *)QString::indexOf((QString *)in_stack_fffffffffffffec8,in_stack_fffffffffffffeee,
                                    CONCAT17(in_stack_fffffffffffffec7,
                                             CONCAT16(in_stack_fffffffffffffec6,
                                                      in_stack_fffffffffffffec0)),
                                    (CaseSensitivity)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  local_38.m_size = -0x5555555555555556;
  local_38.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>((QStringView *)this,(QString *)in_stack_fffffffffffffec8);
  if (__file != (char *)0xffffffffffffffff) {
    QStringView::truncate(&local_38,__file,__length);
  }
  local_3c = 0xffffffff;
  QChar::QChar<char16_t,_true>(&local_3e,L':');
  bVar1 = QStringView::contains
                    ((QStringView *)
                     CONCAT17(in_stack_fffffffffffffec7,
                              CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                     (QChar)(char16_t)((ulong)in_RDI >> 0x30),
                     (CaseSensitivity)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  if (__file != (char *)0xffffffffffffffff) {
    if (!bVar1) {
      in_stack_fffffffffffffec8 = in_RSI;
      QChar::QChar<char16_t,_true>(&local_40,L'.');
      qVar4 = QString::indexOf((QString *)in_stack_fffffffffffffec8,in_stack_fffffffffffffeee,
                               CONCAT17(in_stack_fffffffffffffec7,
                                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0
                                                )),
                               (CaseSensitivity)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if (qVar4 != -1) {
        local_48 = 0xaaaaaaaaaaaaaaaa;
        QHostAddress((QHostAddress *)
                     CONCAT17(in_stack_fffffffffffffec7,
                              CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
        local_49.length = 0xaa;
        QNetmask::QNetmask(&local_49);
        QString::mid((longlong)local_68,(longlong)in_RSI);
        bVar2 = setAddress((QHostAddress *)
                           CONCAT17(in_stack_fffffffffffffec7,
                                    CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                           (QString *)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffec7 = bVar2 ^ 0xff;
        QString::~QString((QString *)0x217f82);
        if ((in_stack_fffffffffffffec7 & 1) == 0) {
          bVar2 = QNetmask::setAddress((QNetmask *)this_00.d.d.ptr,(QHostAddress *)in_RDI);
          if (bVar2) {
            local_3c = QNetmask::prefixLength(&local_49);
            bVar2 = false;
          }
          else {
            std::pair<QHostAddress,_int>::pair
                      ((pair<QHostAddress,_int> *)
                       CONCAT17(in_stack_fffffffffffffec7,
                                CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                       in_stack_fffffffffffffeb8);
            bVar2 = true;
          }
        }
        else {
          std::pair<QHostAddress,_int>::pair
                    ((pair<QHostAddress,_int> *)
                     CONCAT17(in_stack_fffffffffffffec7,
                              CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                     in_stack_fffffffffffffeb8);
          bVar2 = true;
        }
        ~QHostAddress((QHostAddress *)0x218006);
        if (bVar2) goto LAB_0021846d;
        goto LAB_002180ae;
      }
    }
    local_69 = 0xaa;
    QStringView::QStringView<QString,_true>
              ((QStringView *)this,(QString *)in_stack_fffffffffffffec8);
    local_80 = QStringView::mid((QStringView *)in_RDI,
                                CONCAT26(in_stack_fffffffffffffeee.ucs,
                                         CONCAT24(in_stack_fffffffffffffeec,
                                                  in_stack_fffffffffffffee8)),
                                (qsizetype)this_00.d.d.ptr);
    local_3c = QStringView::toUInt((QStringView *)in_stack_fffffffffffffec8,
                                   (bool *)CONCAT17(in_stack_fffffffffffffec7,
                                                    CONCAT16(in_stack_fffffffffffffec6,
                                                             in_stack_fffffffffffffec0)),
                                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if ((local_69 & 1) == 0) {
      std::pair<QHostAddress,_int>::pair
                ((pair<QHostAddress,_int> *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                 in_stack_fffffffffffffeb8);
      goto LAB_0021846d;
    }
  }
LAB_002180ae:
  if (bVar1) {
    if ((int)local_3c < 0x81) {
      if ((int)local_3c < 0) {
        local_3c = 0x80;
      }
      local_98 = 0xaaaaaaaaaaaaaaaa;
      QHostAddress((QHostAddress *)
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      QStringView::toString
                ((QStringView *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      bVar1 = setAddress((QHostAddress *)
                         CONCAT17(in_stack_fffffffffffffec7,
                                  CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                         (QString *)in_stack_fffffffffffffeb8);
      bVar3 = bVar1 ^ 0xff;
      QString::~QString((QString *)0x218153);
      if ((bVar3 & 1) == 0) {
        QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                  ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x218186);
        clearBits((quint8 *)this,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                  (int)in_stack_fffffffffffffec8);
        std::pair<QHostAddress,_int>::pair<QHostAddress_&,_int_&,_true>
                  (this,&in_stack_fffffffffffffec8->first,
                   (int *)CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(bVar3,in_stack_fffffffffffffec0)));
      }
      else {
        std::pair<QHostAddress,_int>::pair
                  ((pair<QHostAddress,_int> *)
                   CONCAT17(in_stack_fffffffffffffec7,CONCAT16(bVar3,in_stack_fffffffffffffec0)),
                   in_stack_fffffffffffffeb8);
      }
      ~QHostAddress((QHostAddress *)0x2181cd);
    }
    else {
      std::pair<QHostAddress,_int>::pair
                ((pair<QHostAddress,_int> *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                 in_stack_fffffffffffffeb8);
    }
  }
  else if ((int)local_3c < 0x21) {
    local_c8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_c8[0].d.ptr = (QStringView *)0xaaaaaaaaaaaaaaaa;
    local_c8[0].d.size = -0x5555555555555556;
    QChar::QChar<char16_t,_true>(&local_ca,L'.');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               (SplitBehaviorFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    QStringView::split((QChar)(char16_t)local_c8,(QFlags_conflict *)&local_38,
                       (uint)(ushort)local_ca.ucs);
    bVar1 = QList<QStringView>::isEmpty((QList<QStringView> *)0x218277);
    if ((bVar1) || (qVar4 = QList<QStringView>::size(local_c8), 4 < qVar4)) {
      std::pair<QHostAddress,_int>::pair
                ((pair<QHostAddress,_int> *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                 in_stack_fffffffffffffeb8);
    }
    else {
      QList<QStringView>::constLast((QList<QStringView> *)in_stack_fffffffffffffeb8);
      bVar1 = QStringView::isEmpty((QStringView *)0x2182c2);
      if (bVar1) {
        QList<QStringView>::removeLast
                  ((QList<QStringView> *)
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      }
      i_00 = (pair<QHostAddress,_int> *)0x0;
      qVar4 = QList<QStringView>::size(local_c8);
      if ((long)i_00 < qVar4) {
        QList<QStringView>::at
                  ((QList<QStringView> *)
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                   (qsizetype)i_00);
        QStringView::toUInt((QStringView *)in_stack_fffffffffffffec8,
                            (bool *)CONCAT17(in_stack_fffffffffffffec7,
                                             CONCAT16(in_stack_fffffffffffffec6,
                                                      in_stack_fffffffffffffec0)),
                            (int)((ulong)i_00 >> 0x20));
        std::pair<QHostAddress,_int>::pair
                  ((pair<QHostAddress,_int> *)
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),i_00);
      }
      else {
        QList<QStringView>::size(local_c8);
        if (local_3c == 0xffffffff) {
          qVar4 = QList<QStringView>::size(local_c8);
          local_3c = (uint)(qVar4 << 3);
        }
        QHostAddress(&this->first,(quint32)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        std::pair<QHostAddress,_int>::pair<QHostAddress,_int_&,_true>
                  (this,&in_stack_fffffffffffffec8->first,
                   (int *)CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
        ~QHostAddress((QHostAddress *)0x218458);
      }
    }
    QList<QStringView>::~QList((QList<QStringView> *)0x21846d);
  }
  else {
    std::pair<QHostAddress,_int>::pair
              ((pair<QHostAddress,_int> *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               in_stack_fffffffffffffeb8);
  }
LAB_0021846d:
  std::pair<QHostAddress,_int>::~pair((pair<QHostAddress,_int> *)0x21847a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar5._8_8_ = extraout_RDX;
    pVar5.first.d.d.ptr = this_00.d.d.ptr;
    return pVar5;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<QHostAddress, int> QHostAddress::parseSubnet(const QString &subnet)
{
    // We support subnets in the form:
    //   ddd.ddd.ddd.ddd/nn
    //   ddd.ddd.ddd/nn
    //   ddd.ddd/nn
    //   ddd/nn
    //   ddd.ddd.ddd.
    //   ddd.ddd.ddd
    //   ddd.ddd.
    //   ddd.ddd
    //   ddd.
    //   ddd
    //   <ipv6-address>/nn
    //
    //  where nn can be an IPv4-style netmask for the IPv4 forms

    const std::pair<QHostAddress, int> invalid = std::pair(QHostAddress(), -1);
    if (subnet.isEmpty())
        return invalid;

    qsizetype slash = subnet.indexOf(u'/');
    QStringView netStr(subnet);
    if (slash != -1)
        netStr.truncate(slash);

    int netmask = -1;
    bool isIpv6 = netStr.contains(u':');

    if (slash != -1) {
        // is the netmask given in IP-form or in bit-count form?
        if (!isIpv6 && subnet.indexOf(u'.', slash + 1) != -1) {
            // IP-style, convert it to bit-count form
            QHostAddress mask;
            QNetmask parser;
            if (!mask.setAddress(subnet.mid(slash + 1)))
                return invalid;
            if (!parser.setAddress(mask))
                return invalid;
            netmask = parser.prefixLength();
        } else {
            bool ok;
            netmask = QStringView{subnet}.mid(slash + 1).toUInt(&ok);
            if (!ok)
                return invalid;     // failed to parse the subnet
        }
    }

    if (isIpv6) {
        // looks like it's an IPv6 address
        if (netmask > 128)
            return invalid;     // invalid netmask
        if (netmask < 0)
            netmask = 128;

        QHostAddress net;
        if (!net.setAddress(netStr.toString()))
            return invalid;     // failed to parse the IP

        clearBits(net.d->a6.c, netmask, 128);
        return std::pair(net, netmask);
    }

    if (netmask > 32)
        return invalid;         // invalid netmask

    // parse the address manually
    auto parts = netStr.split(u'.');
    if (parts.isEmpty() || parts.size() > 4)
        return invalid;         // invalid IPv4 address

    if (parts.constLast().isEmpty())
        parts.removeLast();

    quint32 addr = 0;
    for (int i = 0; i < parts.size(); ++i) {
        bool ok;
        uint byteValue = parts.at(i).toUInt(&ok);
        if (!ok || byteValue > 255)
            return invalid;     // invalid IPv4 address

        addr <<= 8;
        addr += byteValue;
    }
    addr <<= 8 * (4 - parts.size());
    if (netmask == -1) {
        netmask = 8 * parts.size();
    } else if (netmask == 0) {
        // special case here
        // x86's instructions "shr" and "shl" do not operate when
        // their argument is 32, so the code below doesn't work as expected
        addr = 0;
    } else if (netmask != 32) {
        // clear remaining bits
        quint32 mask = quint32(0xffffffff) >> (32 - netmask) << (32 - netmask);
        addr &= mask;
    }

    return std::pair(QHostAddress(addr), netmask);
}